

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O1

int run_test_handle_type_name(void)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  long *plVar6;
  int *piVar7;
  long *__ptr;
  void *__ptr_00;
  long *extraout_RAX;
  long *extraout_RAX_00;
  long *extraout_RAX_01;
  undefined8 uVar8;
  long *unaff_RBX;
  int *piVar9;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_4b0;
  undefined1 auStack_4a4 [4];
  long lStack_4a0;
  long alStack_498 [35];
  undefined8 auStack_380 [29];
  undefined1 auStack_298 [16];
  undefined1 auStack_288 [88];
  undefined1 auStack_230 [184];
  undefined1 auStack_178 [216];
  undefined8 uStack_a0;
  long *plStack_98;
  long lStack_90;
  char *pcStack_88;
  long *plStack_80;
  char *pcStack_78;
  long *plStack_70;
  ulong uStack_60;
  ulong uStack_58;
  
  pcVar3 = (char *)uv_handle_type_name(7);
  iVar1 = strcmp(pcVar3,"pipe");
  if (iVar1 == 0) {
    pcVar3 = (char *)uv_handle_type_name(0xf);
    iVar1 = strcmp(pcVar3,"udp");
    if (iVar1 != 0) goto LAB_0019e843;
    pcVar3 = (char *)uv_handle_type_name(0x11);
    iVar1 = strcmp(pcVar3,"file");
    if (iVar1 != 0) goto LAB_0019e852;
    lVar4 = uv_handle_type_name(0x12);
    if (lVar4 != 0) goto LAB_0019e861;
    lVar4 = uv_handle_type_name(0x13);
    if (lVar4 != 0) goto LAB_0019e869;
    lVar4 = uv_handle_type_name(0);
    if (lVar4 == 0) {
      return 0;
    }
  }
  else {
    run_test_handle_type_name_cold_1();
LAB_0019e843:
    run_test_handle_type_name_cold_2();
LAB_0019e852:
    run_test_handle_type_name_cold_3();
LAB_0019e861:
    run_test_handle_type_name_cold_4();
LAB_0019e869:
    run_test_handle_type_name_cold_5();
  }
  run_test_handle_type_name_cold_6();
  pcVar3 = (char *)uv_req_type_name(1);
  iVar1 = strcmp(pcVar3,"req");
  if (iVar1 == 0) {
    pcVar3 = (char *)uv_req_type_name(5);
    iVar1 = strcmp(pcVar3,"udp_send");
    if (iVar1 != 0) goto LAB_0019e960;
    pcVar3 = (char *)uv_req_type_name(7);
    iVar1 = strcmp(pcVar3,"work");
    if (iVar1 != 0) goto LAB_0019e96f;
    lVar4 = uv_req_type_name(0xb);
    if (lVar4 != 0) goto LAB_0019e97e;
    lVar4 = uv_req_type_name(0xc);
    if (lVar4 != 0) goto LAB_0019e986;
    lVar4 = uv_req_type_name(0);
    if (lVar4 == 0) {
      return 0;
    }
  }
  else {
    run_test_req_type_name_cold_1();
LAB_0019e960:
    run_test_req_type_name_cold_2();
LAB_0019e96f:
    run_test_req_type_name_cold_3();
LAB_0019e97e:
    run_test_req_type_name_cold_4();
LAB_0019e986:
    run_test_req_type_name_cold_5();
  }
  run_test_req_type_name_cold_6();
  plStack_70 = (long *)0x19e9a6;
  sVar5 = uv_loop_size();
  plStack_70 = (long *)0x19e9ae;
  plVar6 = (long *)malloc(sVar5);
  if (plVar6 == (long *)0x0) {
    plStack_70 = (long *)0x19ecc9;
    run_test_getters_setters_cold_18();
LAB_0019ecc9:
    plStack_70 = (long *)0x19ecd8;
    run_test_getters_setters_cold_1();
LAB_0019ecd8:
    plStack_70 = (long *)0x19ecdd;
    run_test_getters_setters_cold_2();
LAB_0019ecdd:
    plStack_70 = (long *)0x19ece5;
    run_test_getters_setters_cold_3();
LAB_0019ece5:
    plStack_70 = (long *)0x19ecf4;
    run_test_getters_setters_cold_4();
LAB_0019ecf4:
    plStack_70 = (long *)0x19ed03;
    run_test_getters_setters_cold_5();
    plStack_80 = extraout_RAX;
LAB_0019ed03:
    pcVar3 = "uv_handle_get_loop((uv_handle_t*)pipe)";
    uVar8 = 0x4e;
  }
  else {
    plStack_70 = (long *)0x19e9c2;
    iVar1 = uv_loop_init(plVar6);
    uStack_58 = (ulong)iVar1;
    uStack_60 = 0;
    unaff_RBX = plVar6;
    if (uStack_58 != 0) goto LAB_0019ecc9;
    plStack_70 = (long *)0x19e9f4;
    uv_loop_set_data(plVar6,&cookie1);
    if ((int *)*plVar6 != &cookie1) goto LAB_0019ecd8;
    plStack_70 = (long *)0x19ea08;
    piVar7 = (int *)uv_loop_get_data(plVar6);
    if (piVar7 != &cookie1) goto LAB_0019ecdd;
    plStack_70 = (long *)0x19ea1b;
    sVar5 = uv_handle_size(7);
    plStack_70 = (long *)0x19ea23;
    __ptr = (long *)malloc(sVar5);
    plStack_70 = (long *)0x19ea33;
    iVar1 = uv_pipe_init(plVar6,__ptr,0);
    uStack_58 = (ulong)iVar1;
    uStack_60 = 0;
    if (uStack_58 != 0) goto LAB_0019ece5;
    plStack_70 = (long *)0x19ea5b;
    uVar2 = uv_handle_get_type(__ptr);
    uStack_58 = (ulong)uVar2;
    uStack_60 = 7;
    if (uStack_58 != 7) goto LAB_0019ecf4;
    plStack_70 = (long *)0x19ea83;
    plStack_80 = (long *)uv_handle_get_loop(__ptr);
    if (plStack_80 != plVar6) goto LAB_0019ed03;
    piVar9 = &cookie2;
    *__ptr = (long)&cookie2;
    plStack_70 = (long *)0x19ea9e;
    piVar7 = (int *)uv_handle_get_data(__ptr);
    if (piVar7 == &cookie2) {
      plStack_70 = (long *)0x19eab2;
      uv_handle_set_data(__ptr,&cookie1);
      plStack_70 = (long *)0x19eaba;
      piVar7 = (int *)uv_handle_get_data(__ptr);
      if (piVar7 != &cookie1) goto LAB_0019ed45;
      if ((int *)*__ptr != &cookie1) goto LAB_0019ed4d;
      plStack_70 = (long *)0x19ead7;
      uStack_58 = uv_stream_get_write_queue_size(__ptr);
      uStack_60 = 0;
      if (uStack_58 != 0) goto LAB_0019ed52;
      __ptr[8] = __ptr[8] + 1;
      uStack_58 = 1;
      plStack_70 = (long *)0x19eb0a;
      uStack_60 = uv_stream_get_write_queue_size(__ptr);
      if (uStack_58 != uStack_60) goto LAB_0019ed61;
      __ptr[8] = __ptr[8] + -1;
      plStack_70 = (long *)0x19eb2d;
      uv_close(__ptr,0);
      plStack_70 = (long *)0x19eb37;
      iVar1 = uv_run(plVar6,0);
      uStack_58 = (ulong)iVar1;
      uStack_60 = 0;
      if (uStack_58 != 0) goto LAB_0019ed70;
      plStack_70 = (long *)0x19eb61;
      sVar5 = uv_req_size(6);
      plStack_70 = (long *)0x19eb69;
      __ptr_00 = malloc(sVar5);
      plStack_70 = (long *)0x19eb80;
      uv_fs_stat(plVar6,__ptr_00,".",0);
      plStack_70 = (long *)0x19eb8a;
      iVar1 = uv_run(plVar6,0);
      uStack_58 = (ulong)iVar1;
      uStack_60 = 0;
      if (uStack_58 != 0) goto LAB_0019ed7f;
      plStack_70 = (long *)0x19ebb2;
      plStack_80 = (long *)uv_req_get_loop(__ptr_00);
      if (plStack_80 == plVar6) {
        plStack_70 = (long *)0x19ebc3;
        iVar1 = uv_fs_get_type(__ptr_00);
        uStack_58 = (ulong)iVar1;
        uStack_60 = 6;
        if (uStack_58 == 6) {
          plStack_70 = (long *)0x19ebeb;
          uStack_58 = uv_fs_get_result(__ptr_00);
          uStack_60 = 0;
          if (uStack_58 != 0) goto LAB_0019eddb;
          plStack_70 = (long *)0x19ec11;
          piVar9 = (int *)uv_fs_get_ptr(__ptr_00);
          plStack_70 = (long *)0x19ec1c;
          plStack_70 = (long *)uv_fs_get_statbuf(__ptr_00);
          if ((long *)piVar9 == plStack_70) {
            plStack_70 = (long *)0x19ec2d;
            lVar4 = uv_fs_get_statbuf(__ptr_00);
            if ((*(byte *)(lVar4 + 9) & 0x40) == 0) {
              plStack_70 = (long *)0x19ee3c;
              run_test_getters_setters_cold_17();
LAB_0019ee3c:
              plStack_70 = (long *)0x19ee4b;
              run_test_getters_setters_cold_15();
            }
            else {
              plStack_70 = (long *)0x19ec3f;
              pcVar3 = (char *)uv_fs_get_path(__ptr_00);
              plStack_70 = (long *)0x19ec4e;
              iVar1 = strcmp(pcVar3,".");
              uStack_58 = (ulong)iVar1;
              uStack_60 = 0;
              if (uStack_58 != 0) goto LAB_0019ee3c;
              plStack_70 = (long *)0x19ec76;
              uv_fs_req_cleanup(__ptr_00);
              plStack_70 = (long *)0x19ec7e;
              iVar1 = uv_loop_close(plVar6);
              uStack_58 = (ulong)iVar1;
              uStack_60 = 0;
              if (uStack_58 == 0) {
                plStack_70 = (long *)0x19eca6;
                free(__ptr);
                plStack_70 = (long *)0x19ecae;
                free(__ptr_00);
                plStack_70 = (long *)0x19ecb6;
                free(plVar6);
                return 0;
              }
            }
            plStack_70 = (long *)0x19ee5a;
            run_test_getters_setters_cold_16();
            plStack_80 = (long *)0x0;
            plStack_98 = (long *)0x19ee70;
            plStack_70 = plVar6;
            iVar1 = uv_gettimeofday();
            pcStack_88 = (char *)(long)iVar1;
            lStack_90 = 0;
            if (pcStack_88 == (char *)0x0) {
              pcStack_88 = (char *)0x0;
              lStack_90 = (long)plStack_80;
              if (plStack_80 == (long *)0x0) goto LAB_0019eed9;
              plStack_98 = (long *)0x19eeaa;
              iVar1 = uv_gettimeofday(0);
              pcStack_88 = (char *)(long)iVar1;
              lStack_90 = -0x16;
              if (pcStack_88 == (char *)0xffffffffffffffea) {
                return 0;
              }
            }
            else {
              plStack_98 = (long *)0x19eed9;
              run_test_gettimeofday_cold_1();
LAB_0019eed9:
              plStack_98 = (long *)0x19eee6;
              run_test_gettimeofday_cold_3();
            }
            plStack_98 = (long *)0x19eef3;
            run_test_gettimeofday_cold_2();
            uStack_a0 = 0;
            plStack_98 = __ptr;
            uVar8 = uv_default_loop();
            iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_298);
            alStack_498[0] = (long)iVar1;
            auStack_380[0] = 0;
            if (alStack_498[0] == 0) {
              iVar1 = uv_idle_init(uVar8,auStack_288);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0;
              if (alStack_498[0] != 0) goto LAB_0019f492;
              iVar1 = uv_fileno(auStack_288,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0xffffffffffffffea;
              if (alStack_498[0] != -0x16) goto LAB_0019f4a4;
              uv_close(auStack_288,0);
              iVar1 = uv_tcp_init(uVar8,auStack_178);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0;
              if (alStack_498[0] != 0) goto LAB_0019f4b6;
              iVar1 = uv_fileno(auStack_178,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0xfffffffffffffff7;
              if (alStack_498[0] != -9) goto LAB_0019f4c8;
              iVar1 = uv_tcp_bind(auStack_178,auStack_298,0);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0;
              if (alStack_498[0] != 0) goto LAB_0019f4da;
              iVar1 = uv_fileno(auStack_178,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0;
              if (alStack_498[0] != 0) goto LAB_0019f4ec;
              uv_close(auStack_178,0);
              iVar1 = uv_fileno(auStack_178,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0xfffffffffffffff7;
              if (alStack_498[0] != -9) goto LAB_0019f4fe;
              iVar1 = uv_udp_init(uVar8,auStack_230);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0;
              if (alStack_498[0] != 0) goto LAB_0019f510;
              iVar1 = uv_fileno(auStack_230,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0xfffffffffffffff7;
              if (alStack_498[0] != -9) goto LAB_0019f522;
              iVar1 = uv_udp_bind(auStack_230,auStack_298,0);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0;
              if (alStack_498[0] != 0) goto LAB_0019f534;
              iVar1 = uv_fileno(auStack_230,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0;
              if (alStack_498[0] != 0) goto LAB_0019f546;
              uv_close(auStack_230,0);
              iVar1 = uv_fileno(auStack_230,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              auStack_380[0] = 0xfffffffffffffff7;
              if (alStack_498[0] != -9) goto LAB_0019f558;
              iVar1 = uv_pipe_init(uVar8,auStack_380,0);
              alStack_498[0] = (long)iVar1;
              lStack_4b0 = 0;
              if (alStack_498[0] != 0) goto LAB_0019f56a;
              iVar1 = uv_fileno(auStack_380,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              lStack_4b0 = -9;
              if (alStack_498[0] != -9) goto LAB_0019f579;
              iVar1 = uv_pipe_bind(auStack_380,"/tmp/uv-test-sock");
              alStack_498[0] = (long)iVar1;
              lStack_4b0 = 0;
              if (alStack_498[0] != 0) goto LAB_0019f588;
              iVar1 = uv_fileno(auStack_380,auStack_4a4);
              alStack_498[0] = (long)iVar1;
              lStack_4b0 = 0;
              if (alStack_498[0] != 0) goto LAB_0019f597;
              uv_close(auStack_380,0);
              iVar1 = uv_fileno(auStack_380);
              alStack_498[0] = (long)iVar1;
              lStack_4b0 = -9;
              if (alStack_498[0] != -9) goto LAB_0019f5a6;
              iVar1 = open64("/dev/tty",0,0);
              if (iVar1 == -1) {
                run_test_handle_fileno_cold_26();
LAB_0019f41a:
                uv_run(uVar8,0);
                uv_walk(uVar8,close_walk_cb,0);
                uv_run(uVar8,0);
                lStack_4b0 = 0;
                iVar1 = uv_loop_close(uVar8);
                lStack_4a0 = (long)iVar1;
                if (lStack_4b0 == lStack_4a0) {
                  uv_library_shutdown();
                  return 0;
                }
                goto LAB_0019f5b5;
              }
              iVar1 = uv_tty_init(uVar8,alStack_498,iVar1,0);
              lStack_4b0 = (long)iVar1;
              lStack_4a0 = 0;
              if (lStack_4b0 != 0) goto LAB_0019f5c4;
              iVar1 = uv_is_readable(alStack_498);
              if (iVar1 == 0) goto LAB_0019f5d3;
              iVar1 = uv_is_writable(alStack_498);
              if (iVar1 != 0) goto LAB_0019f5d8;
              iVar1 = uv_fileno(alStack_498,auStack_4a4);
              lStack_4b0 = (long)iVar1;
              lStack_4a0 = 0;
              if (lStack_4b0 != 0) goto LAB_0019f5dd;
              uv_close(alStack_498,0);
              iVar1 = uv_fileno(alStack_498,auStack_4a4);
              lStack_4b0 = (long)iVar1;
              lStack_4a0 = -9;
              if (lStack_4b0 != -9) goto LAB_0019f5ec;
              plVar6 = alStack_498;
              iVar1 = uv_is_readable(plVar6);
              if (iVar1 == 0) {
                plVar6 = alStack_498;
                iVar1 = uv_is_writable(plVar6);
                if (iVar1 != 0) goto LAB_0019f600;
                goto LAB_0019f41a;
              }
            }
            else {
              run_test_handle_fileno_cold_1();
LAB_0019f492:
              run_test_handle_fileno_cold_2();
LAB_0019f4a4:
              run_test_handle_fileno_cold_3();
LAB_0019f4b6:
              run_test_handle_fileno_cold_4();
LAB_0019f4c8:
              run_test_handle_fileno_cold_5();
LAB_0019f4da:
              run_test_handle_fileno_cold_6();
LAB_0019f4ec:
              run_test_handle_fileno_cold_7();
LAB_0019f4fe:
              run_test_handle_fileno_cold_8();
LAB_0019f510:
              run_test_handle_fileno_cold_9();
LAB_0019f522:
              run_test_handle_fileno_cold_10();
LAB_0019f534:
              run_test_handle_fileno_cold_11();
LAB_0019f546:
              run_test_handle_fileno_cold_12();
LAB_0019f558:
              run_test_handle_fileno_cold_13();
LAB_0019f56a:
              run_test_handle_fileno_cold_14();
LAB_0019f579:
              run_test_handle_fileno_cold_15();
LAB_0019f588:
              run_test_handle_fileno_cold_16();
LAB_0019f597:
              run_test_handle_fileno_cold_17();
LAB_0019f5a6:
              run_test_handle_fileno_cold_18();
LAB_0019f5b5:
              run_test_handle_fileno_cold_27();
LAB_0019f5c4:
              run_test_handle_fileno_cold_19();
LAB_0019f5d3:
              run_test_handle_fileno_cold_25();
LAB_0019f5d8:
              run_test_handle_fileno_cold_20();
LAB_0019f5dd:
              run_test_handle_fileno_cold_21();
LAB_0019f5ec:
              plVar6 = &lStack_4b0;
              run_test_handle_fileno_cold_22();
            }
            run_test_handle_fileno_cold_23();
LAB_0019f600:
            run_test_handle_fileno_cold_24();
            iVar1 = uv_is_closing();
            if (iVar1 != 0) {
              return iVar1;
            }
            iVar1 = uv_close(plVar6,0);
            return iVar1;
          }
        }
        else {
          plStack_70 = (long *)0x19eddb;
          run_test_getters_setters_cold_13();
LAB_0019eddb:
          plStack_70 = (long *)0x19edea;
          run_test_getters_setters_cold_14();
          plStack_70 = extraout_RAX_01;
        }
        pcStack_88 = "uv_fs_get_statbuf(fs)";
        pcVar3 = "uv_fs_get_ptr(fs)";
        uVar8 = 0x67;
        plStack_80 = (long *)piVar9;
        goto LAB_0019ee27;
      }
    }
    else {
      plStack_70 = (long *)0x19ed45;
      run_test_getters_setters_cold_6();
LAB_0019ed45:
      plStack_70 = (long *)0x19ed4d;
      run_test_getters_setters_cold_7();
LAB_0019ed4d:
      plStack_70 = (long *)0x19ed52;
      run_test_getters_setters_cold_8();
LAB_0019ed52:
      plStack_70 = (long *)0x19ed61;
      run_test_getters_setters_cold_9();
LAB_0019ed61:
      plStack_70 = (long *)0x19ed70;
      run_test_getters_setters_cold_10();
LAB_0019ed70:
      plStack_70 = (long *)0x19ed7f;
      run_test_getters_setters_cold_11();
LAB_0019ed7f:
      plStack_70 = (long *)0x19ed8e;
      run_test_getters_setters_cold_12();
      plStack_80 = extraout_RAX_00;
    }
    pcVar3 = "uv_req_get_loop((uv_req_t*)fs)";
    uVar8 = 100;
  }
  pcStack_88 = "loop";
  plStack_70 = unaff_RBX;
LAB_0019ee27:
  pcStack_78 = "==";
  lStack_90 = 0x19ee2e;
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getters-setters.c"
          ,uVar8,pcVar3);
  plStack_70 = (long *)0x19ee37;
  abort();
}

Assistant:

TEST_IMPL(handle_type_name) {
  ASSERT_OK(strcmp(uv_handle_type_name(UV_NAMED_PIPE), "pipe"));
  ASSERT_OK(strcmp(uv_handle_type_name(UV_UDP), "udp"));
  ASSERT_OK(strcmp(uv_handle_type_name(UV_FILE), "file"));
  ASSERT_NULL(uv_handle_type_name(UV_HANDLE_TYPE_MAX));
  ASSERT_NULL(uv_handle_type_name(UV_HANDLE_TYPE_MAX + 1));
  ASSERT_NULL(uv_handle_type_name(UV_UNKNOWN_HANDLE));
  return 0;
}